

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strchr32_63(UChar *s,UChar32 c)

{
  UChar *pUVar1;
  UChar trail;
  UChar lead;
  UChar cs;
  UChar32 c_local;
  UChar *s_local;
  
  if ((uint)c < 0x10000) {
    s_local = u_strchr_63(s,(UChar)c);
  }
  else if ((uint)c < 0x110000) {
    pUVar1 = s;
    do {
      _lead = pUVar1;
      pUVar1 = _lead + 1;
      if (*_lead == L'\0') {
        return (UChar *)0x0;
      }
    } while ((*_lead != (UChar)((short)(c >> 10) + L'ퟀ')) ||
            (*pUVar1 != ((UChar)c & 0x3ffU | 0xdc00U)));
    s_local = _lead;
  }
  else {
    s_local = (UChar *)0x0;
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strchr32(const UChar *s, UChar32 c) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_strchr(s, (UChar)c);
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        UChar cs, lead=U16_LEAD(c), trail=U16_TRAIL(c);

        while((cs=*s++)!=0) {
            if(cs==lead && *s==trail) {
                return (UChar *)(s-1);
            }
        }
        return NULL;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}